

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_print(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  TextOutputMethod p_Var1;
  bool bVar2;
  String SVar3;
  String SVar4;
  String SVar5;
  Value local_d0;
  Value local_c0;
  String local_b0;
  undefined1 local_a0 [32];
  String local_80;
  undefined1 local_70 [8];
  Value delimiter;
  String local_40;
  undefined1 local_30 [8];
  Value s;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  s.data = (anon_union_8_3_2f476f46_for_data)partialResult;
  String::String(&local_40,"s");
  Context::GetVar((Context *)local_30,(String *)context,(LocalOnlyMode)&local_40);
  String::~String(&local_40);
  bVar2 = Value::IsNull((Value *)local_30);
  if (bVar2) {
    Value::Value((Value *)&delimiter.data,"null");
    Value::operator=((Value *)local_30,(Value *)&delimiter.data);
    Value::~Value((Value *)&delimiter.data);
  }
  String::String(&local_80,"delimiter");
  Context::GetVar((Context *)local_70,(String *)context,(LocalOnlyMode)&local_80);
  String::~String(&local_80);
  bVar2 = Value::IsNull((Value *)local_70);
  if (bVar2) {
    p_Var1 = context->vm->standardOutput;
    SVar4 = Value::ToString((Value *)(local_a0 + 0x10),(Machine *)local_30);
    SVar5._8_8_ = 0;
    SVar5.ss = (StringStorage *)(local_a0 + 0x10);
    (*p_Var1)(SVar5,SVar4.isTemp);
    String::~String((String *)(local_a0 + 0x10));
  }
  else {
    bVar2 = Value::operator==((Value *)local_70,(Value *)_EOL);
    if (bVar2) {
      p_Var1 = context->vm->standardOutput;
      SVar5 = Value::ToString((Value *)local_a0,(Machine *)local_30);
      SVar4._8_8_ = 1;
      SVar4.ss = (StringStorage *)local_a0;
      (*p_Var1)(SVar4,SVar5.isTemp);
      String::~String((String *)local_a0);
    }
    else {
      p_Var1 = context->vm->standardOutput;
      Value::ToString(&local_c0,(Machine *)local_30);
      Value::ToString(&local_d0,(Machine *)local_70);
      SVar5 = String::operator+(&local_b0,(String *)&local_c0);
      SVar3._8_8_ = 0;
      SVar3.ss = (StringStorage *)&local_b0;
      (*p_Var1)(SVar3,SVar5.isTemp);
      String::~String(&local_b0);
      String::~String((String *)&local_d0);
      String::~String((String *)&local_c0);
    }
  }
  IntrinsicResult::IntrinsicResult
            ((IntrinsicResult *)this,(IntrinsicResult *)&IntrinsicResult::Null);
  Value::~Value((Value *)local_70);
  Value::~Value((Value *)local_30);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_print(Context *context, IntrinsicResult partialResult) {
		Value s = context->GetVar("s");
		if (s.IsNull()) s = "null";
		Value delimiter = context->GetVar("delimiter");
		if (delimiter.IsNull()) {
			(*context->vm->standardOutput)(s.ToString(), false);
		} else if (delimiter == _EOL) {
			(*context->vm->standardOutput)(s.ToString(), true);
		} else {
			(*context->vm->standardOutput)(s.ToString() + delimiter.ToString(), false);
		}
		return IntrinsicResult::Null;
	}